

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O1

void duckdb_libpgquery::pg_parser_init(void)

{
  long lVar1;
  undefined8 *puVar2;
  
  lVar1 = __tls_get_addr(&PTR_024cde38);
  *(undefined4 *)(lVar1 + 0xa58) = 0;
  *(undefined1 *)(lVar1 + 0xa60) = 0;
  *(undefined8 *)(lVar1 + 0x2a78) = 4;
  puVar2 = (undefined8 *)malloc(0x20);
  if (puVar2 != (undefined8 *)0x0) {
    *(undefined8 **)(lVar1 + 0x2a70) = puVar2;
    puVar2[2] = 0;
    puVar2[3] = 0;
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)(lVar1 + 0x2a68) = 0;
    allocate_new((parser_state *)(lVar1 + 0xa58),1);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = rmdir;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void pg_parser_init() {
	pg_parser_state.pg_err_code = PGUNDEFINED;
	pg_parser_state.pg_err_msg[0] = '\0';

	pg_parser_state.malloc_ptr_size = 4;
	auto new_malloc_ptrs = (char **) malloc(sizeof(char *) * pg_parser_state.malloc_ptr_size);
	if (!new_malloc_ptrs) {
		throw std::bad_alloc();
	}
	pg_parser_state.malloc_ptrs = new_malloc_ptrs;
	memset(pg_parser_state.malloc_ptrs, 0, sizeof(char*) * pg_parser_state.malloc_ptr_size);
	pg_parser_state.malloc_ptr_idx = 0;
	allocate_new(&pg_parser_state, 1);
}